

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O1

int __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::access
          (SignalTimeDependent<double,_int> *this,char *__name,int __type)

{
  bool bVar1;
  int iVar2;
  int __type_00;
  
  bVar1 = TimeDependency<int>::needUpdate(&this->super_TimeDependency<int>,(int *)__name);
  if (bVar1) {
    (this->super_TimeDependency<int>).lastAskForUpdate = 0;
    iVar2 = Signal<double,_int>::access
                      ((Signal<double,_int> *)
                       ((long)&(this->super_TimeDependency<int>)._vptr_TimeDependency +
                       (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]),__name,
                       __type_00);
    ((this->super_TimeDependency<int>)._vptr_TimeDependency[-3] + 0x14)
    [(long)&(this->super_TimeDependency<int>).dependencies.
            super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
    ] = (code)0x0;
  }
  else {
    iVar2 = (int)*(undefined8 *)
                  (&this->field_0x48 +
                  (long)(this->super_TimeDependency<int>)._vptr_TimeDependency[-3]);
  }
  return iVar2;
}

Assistant:

const T &SignalTimeDependent<T, Time>::access(const Time &t1) {
  const bool up = TimeDependency<Time>::needUpdate(t1);
  // SignalBase<Time>::setReady(false);

  /*       std::cout << "Time before: "<< signalTime << " -- "   */
  /*            << t1<< "  -> Up: "<<up <<std::endl ;   */
  if (up) {
    TimeDependency<Time>::lastAskForUpdate = false;
    const T &Tres = Signal<T, Time>::access(t1);
    SignalBase<Time>::setReady(false);
    return Tres;
  } else {
    return Signal<T, Time>::accessCopy();
  }
}